

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmMakefile *pcVar1;
  string_view sourceDir;
  bool bVar2;
  byte bVar3;
  Encoding EVar4;
  cmake *this_00;
  string *psVar5;
  ulong uVar6;
  container_type *depFiles_00;
  cmCMakePath *this_01;
  char *pcVar7;
  string_view binaryDir;
  undefined1 local_1400 [8];
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_1190 [8];
  cmGeneratedFileStream ruleFileStream;
  string message_1;
  cmCMakePath local_ee8;
  cmCMakePath local_ec0;
  undefined1 local_e98 [8];
  string targetName_1;
  NotInProjectDir local_e58;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e38;
  allocator<char> local_e11;
  string local_e10;
  string_view local_df0;
  byte local_dd9;
  undefined1 local_dd8 [7];
  bool projectOnly;
  cmDependsCompiler depsManager;
  DependencyMap dependencies;
  string depFile;
  string internalDepFile;
  cmList depFiles;
  string local_d38;
  undefined1 local_d18 [8];
  string depends;
  string message;
  undefined1 local_cb8 [8];
  string targetName;
  cmDependsC checker;
  undefined1 local_1a0 [7];
  bool needRescanDependencies;
  DependencyMap validDependencies;
  int local_14c;
  undefined1 local_148 [4];
  int result_1;
  string dirInfoFile;
  undefined1 local_120 [7];
  bool needRescanDirInfo;
  int local_fc;
  cmFileTimeCache *pcStack_f8;
  int result;
  cmFileTimeCache *ftc;
  undefined1 local_e8 [7];
  bool needRescanDependInfo;
  string dependFile;
  string internalDependFile;
  string local_a0;
  undefined1 local_80 [8];
  string targetDir;
  bool status;
  allocator<char> local_49;
  string local_48;
  byte local_22;
  byte local_21;
  bool color_local;
  string *psStack_20;
  bool verbose_local;
  string *tgtInfo_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_22 = color;
  local_21 = verbose;
  psStack_20 = tgtInfo;
  tgtInfo_local = (string *)this;
  bVar2 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Target DependInfo.cmake file not found",&local_49);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  targetDir.field_2._M_local_buf[0xb] = '\x01';
  CheckMultipleOutputs(this,(bool)(local_21 & 1));
  cmsys::SystemTools::GetFilenamePath((string *)local_80,psStack_20);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_DEPENDS_LANGUAGES",
             (allocator<char> *)(internalDependFile.field_2._M_local_buf + 0xf));
  cmMakefile::GetSafeDefinition(pcVar1,&local_a0);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(internalDependFile.field_2._M_local_buf + 0xf));
  if (((bVar3 ^ 0xff) & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/depend.internal");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/depend.make");
    ftc._7_1_ = 0;
    this_00 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                        );
    pcStack_f8 = cmake::GetFileTimeCache(this_00);
    bVar2 = cmFileTimeCache::Compare
                      (pcStack_f8,(string *)((long)&dependFile.field_2 + 8),psStack_20,&local_fc);
    if ((!bVar2) || (local_fc < 0)) {
      if ((local_21 & 1) != 0) {
        cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
                  ((string *)local_120,(char (*) [11])"Dependee \"",psStack_20,
                   (char (*) [27])"\" is newer than depender \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),(char (*) [4])0x106b7fe);
        cmSystemTools::Stdout((string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
      }
      ftc._7_1_ = 1;
    }
    dirInfoFile.field_2._M_local_buf[0xf] = '\0';
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[44]>
              ((string *)local_148,psVar5,
               (char (*) [44])"/CMakeFiles/CMakeDirectoryInformation.cmake");
    bVar2 = cmFileTimeCache::Compare
                      (pcStack_f8,(string *)((long)&dependFile.field_2 + 8),(string *)local_148,
                       &local_14c);
    if ((!bVar2) || (local_14c < 0)) {
      if ((local_21 & 1) != 0) {
        cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
                  ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (char (*) [11])"Dependee \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (char (*) [27])"\" is newer than depender \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),(char (*) [4])0x106b7fe);
        cmSystemTools::Stdout
                  ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
    }
    std::__cxx11::string::~string((string *)local_148);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_1a0);
    checker.CacheFileName.field_2._M_local_buf[0xf] = '\0';
    if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
      cmDependsC::cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
      cmDepends::SetVerbose((cmDepends *)((long)&targetName.field_2 + 8),(bool)(local_21 & 1));
      cmDepends::SetFileTimeCache((cmDepends *)((long)&targetName.field_2 + 8),pcStack_f8);
      bVar2 = cmDepends::Check((cmDepends *)((long)&targetName.field_2 + 8),(string *)local_e8,
                               (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_1a0)
      ;
      checker.CacheFileName.field_2._M_local_buf[0xf] = (bVar2 ^ 0xffU) & 1;
      cmDependsC::~cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
    }
    if ((((ftc._7_1_ & 1) != 0) || ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) != 0)) ||
       (checker.CacheFileName.field_2._M_local_buf[0xf] != '\0')) {
      if ((local_21 & 1) != 0) {
        cmsys::SystemTools::GetFilenameName((string *)local_cb8,(string *)local_80);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)local_cb8);
        std::__cxx11::string::operator=
                  ((string *)local_cb8,(string *)(message.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        cmStrCat<char_const(&)[33],std::__cxx11::string&>
                  ((string *)((long)&depends.field_2 + 8),
                   (char (*) [33])"Scanning dependencies of target ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cb8);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::MakefileColorEcho(0x106,pcVar7,true,(bool)(local_22 & 1));
        std::__cxx11::string::~string((string *)(depends.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_cb8);
      }
      targetDir.field_2._M_local_buf[0xb] =
           ScanDependencies(this,(string *)local_80,(string *)local_e8,
                            (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_1a0);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)local_1a0);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)(dependFile.field_2._M_local_buf + 8));
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"CMAKE_DEPENDS_DEPENDENCY_FILES",
             (allocator<char> *)
             ((long)&depFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_d38);
  std::__cxx11::string::string((string *)local_d18,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&depFiles.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cmList::cmList((cmList *)((long)&internalDepFile.field_2 + 8),(string *)local_d18,Yes);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&depFile.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/compiler_depend.internal");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/compiler_depend.make");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)&depsManager.LocalGenerator);
    cmDependsCompiler::cmDependsCompiler((cmDependsCompiler *)local_dd8);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e10,"CMAKE_DEPENDS_IN_PROJECT_ONLY",&local_e11);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_e10);
    local_df0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    bVar2 = cmIsOn(local_df0);
    std::__cxx11::string::~string((string *)&local_e10);
    std::allocator<char>::~allocator(&local_e11);
    local_dd9 = bVar2;
    cmDependsCompiler::SetVerbose((cmDependsCompiler *)local_dd8,(bool)(local_21 & 1));
    cmDependsCompiler::SetLocalGenerator((cmDependsCompiler *)local_dd8,this);
    depFiles_00 = cmList::operator_cast_to_vector_((cmList *)((long)&internalDepFile.field_2 + 8));
    if ((local_dd9 & 1) == 0) {
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(&local_e38);
    }
    else {
      psVar5 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
      sourceDir = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      binaryDir = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      targetName_1.field_2._8_8_ = binaryDir._M_len;
      anon_unknown.dwarf_154bd63::NotInProjectDir::NotInProjectDir(&local_e58,sourceDir,binaryDir);
      std::function<bool(std::__cxx11::string_const&)>::
      function<(anonymous_namespace)::NotInProjectDir,void>
                ((function<bool(std::__cxx11::string_const&)> *)&local_e38,&local_e58);
    }
    bVar2 = cmDependsCompiler::CheckDependencies
                      ((cmDependsCompiler *)local_dd8,(string *)((long)&depFile.field_2 + 8),
                       depFiles_00,(DependencyMap *)&depsManager.LocalGenerator,&local_e38);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_e38);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_009c521f:
      internalRuleFileStream._612_4_ = 0;
    }
    else {
      if ((local_21 & 1) != 0) {
        std::__cxx11::string::string
                  ((string *)(message_1.field_2._M_local_buf + 8),(string *)local_80);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  (&local_ee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&message_1.field_2 + 8),generic_format);
        cmCMakePath::GetFileName(&local_ec0,&local_ee8);
        this_01 = cmCMakePath::RemoveExtension(&local_ec0);
        cmCMakePath::GenericString_abi_cxx11_((string *)local_e98,this_01);
        cmCMakePath::~cmCMakePath(&local_ec0);
        cmCMakePath::~cmCMakePath(&local_ee8);
        std::__cxx11::string::~string((string *)(message_1.field_2._M_local_buf + 8));
        cmStrCat<char_const(&)[55],std::__cxx11::string&>
                  ((string *)&ruleFileStream.field_0x260,
                   (char (*) [55])"Consolidate compiler generated dependencies of target ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e98);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::MakefileColorEcho(0x106,pcVar7,true,(bool)(local_22 & 1));
        std::__cxx11::string::~string((string *)&ruleFileStream.field_0x260);
        std::__cxx11::string::~string((string *)local_e98);
      }
      EVar4 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_1190,
                 (string *)&dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,false,
                 EVar4);
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_1190,true);
      bVar3 = std::ios::operator!((ios *)(local_1190 +
                                         (long)*(_func_int **)((long)local_1190 + -0x18)));
      if ((bVar3 & 1) == 0) {
        EVar4 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                  _vptr_cmGlobalGenerator[5])();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_1400,(string *)((long)&depFile.field_2 + 8),false,
                   EVar4);
        bVar3 = std::ios::operator!((ios *)(local_1400 +
                                           (long)*(_func_int **)((long)local_1400 + -0x18)));
        internalRuleFileStream._612_1_ = (bVar3 & 1) != 0;
        if ((bool)internalRuleFileStream._612_1_) {
          this_local._7_1_ = 0;
        }
        else {
          WriteDisclaimer(this,(ostream *)local_1190);
          WriteDisclaimer(this,(ostream *)local_1400);
          cmDependsCompiler::WriteDependencies
                    ((cmDependsCompiler *)local_dd8,(DependencyMap *)&depsManager.LocalGenerator,
                     (ostream *)local_1190,(ostream *)local_1400);
        }
        internalRuleFileStream._613_3_ = 0;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1400);
      }
      else {
        this_local._7_1_ = 0;
        internalRuleFileStream._612_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1190);
      if (internalRuleFileStream._612_4_ == 0) goto LAB_009c521f;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)&depsManager.LocalGenerator);
    std::__cxx11::string::~string
              ((string *)&dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)(depFile.field_2._M_local_buf + 8));
    cmList::~cmList((cmList *)((long)&internalDepFile.field_2 + 8));
    if (internalRuleFileStream._612_4_ != 0) goto LAB_009c52ab;
  }
  this_local._7_1_ = targetDir.field_2._M_local_buf[0xb] & 1;
  internalRuleFileStream._612_4_ = 1;
LAB_009c52ab:
  std::__cxx11::string::~string((string *)local_d18);
  std::__cxx11::string::~string((string *)local_80);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    cmList depFiles{ depends, cmList::EmptyElements::Yes };
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}